

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LToken.cpp
# Opt level: O0

void __thiscall LToken::LToken(LToken *this,LNodeType type,string *str)

{
  string *str_local;
  LNodeType type_local;
  LToken *this_local;
  
  this->type = INVALID;
  std::__cxx11::string::string((string *)&this->token);
  this->type = type;
  std::__cxx11::string::operator=((string *)&this->token,(string *)str);
  return;
}

Assistant:

LToken::LToken(LNodeType type, std::string str) {
    this->type = type;
    this->token = std::move(str);
}